

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<int,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMonthsOperator>
               (int *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  int64_t *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  interval_t iVar10;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar6 = &result_data->micros;
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar10 = ToMonthsOperator::Operation<int,duckdb::interval_t>(ldata[iVar5]);
      ((interval_t *)(piVar6 + -1))->months = (int)iVar10._0_8_;
      ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
      *piVar6 = iVar10.micros;
      piVar6 = piVar6 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar7 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
LAB_00c9caa8:
        piVar6 = &result_data[uVar7].micros;
        for (; uVar3 = uVar7, uVar7 < uVar8; uVar7 = uVar7 + 1) {
          iVar10 = ToMonthsOperator::Operation<int,duckdb::interval_t>(ldata[uVar7]);
          ((interval_t *)(piVar6 + -1))->months = (int)iVar10._0_8_;
          ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
          *piVar6 = iVar10.micros;
          piVar6 = piVar6 + 2;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar8 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_00c9caa8;
        uVar3 = uVar8;
        if (uVar2 != 0) {
          piVar6 = &result_data[uVar7].micros;
          for (uVar9 = 0; uVar3 = uVar7 + uVar9, uVar7 + uVar9 < uVar8; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              iVar10 = ToMonthsOperator::Operation<int,duckdb::interval_t>(ldata[uVar7 + uVar9]);
              ((interval_t *)(piVar6 + -1))->months = (int)iVar10._0_8_;
              ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar10._0_8_ >> 0x20);
              *piVar6 = iVar10.micros;
            }
            piVar6 = piVar6 + 2;
          }
        }
      }
      uVar7 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}